

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_util.cpp
# Opt level: O3

bool duckdb::regexp_util::TryParseConstantPattern
               (ClientContext *context,Expression *expr,string *constant_string)

{
  int iVar1;
  byte bVar2;
  Value pattern_str;
  Value local_68;
  
  iVar1 = (*(expr->super_BaseExpression)._vptr_BaseExpression[0xf])(expr);
  if ((char)iVar1 == '\0') {
    bVar2 = 0;
  }
  else {
    ExpressionExecutor::EvaluateScalar(&local_68,context,expr,false);
    bVar2 = local_68.type_.id_ != VARCHAR | local_68.is_null;
    if (bVar2 == 0) {
      StringValue::Get_abi_cxx11_(&local_68);
      ::std::__cxx11::string::_M_assign((string *)constant_string);
    }
    bVar2 = bVar2 ^ 1;
    Value::~Value(&local_68);
  }
  return (bool)bVar2;
}

Assistant:

bool TryParseConstantPattern(ClientContext &context, Expression &expr, string &constant_string) {
	if (!expr.IsFoldable()) {
		return false;
	}
	Value pattern_str = ExpressionExecutor::EvaluateScalar(context, expr);
	if (!pattern_str.IsNull() && pattern_str.type().id() == LogicalTypeId::VARCHAR) {
		constant_string = StringValue::Get(pattern_str);
		return true;
	}
	return false;
}